

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

uint32_t name_hash(nghttp2_nv *nv)

{
  ulong local_20;
  size_t i;
  uint32_t h;
  nghttp2_nv *nv_local;
  
  i._4_4_ = 0x811c9dc5;
  for (local_20 = 0; local_20 < nv->namelen; local_20 = local_20 + 1) {
    i._4_4_ = (nv->name[local_20] ^ i._4_4_) * 0x1000193;
  }
  return i._4_4_;
}

Assistant:

static uint32_t name_hash(const nghttp2_nv *nv) {
  /* 32 bit FNV-1a: http://isthe.com/chongo/tech/comp/fnv/ */
  uint32_t h = 2166136261u;
  size_t i;

  for (i = 0; i < nv->namelen; ++i) {
    h ^= nv->name[i];
    h += (h << 1) + (h << 4) + (h << 7) + (h << 8) + (h << 24);
  }

  return h;
}